

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O1

int raptor_sockaddr_get_port(raptor_resolved_address *resolved_addr)

{
  ushort uVar1;
  raptor_sockaddr *addr;
  uint uVar2;
  
  uVar1 = *(ushort *)resolved_addr->addr;
  uVar2 = (uint)uVar1;
  if (uVar1 != 1) {
    if ((uVar1 == 10) || (uVar1 == 2)) {
      uVar2 = (uint)(ushort)(*(ushort *)(resolved_addr->addr + 2) << 8 |
                            *(ushort *)(resolved_addr->addr + 2) >> 8);
    }
    else {
      raptor::LogFormatPrint
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
                 ,0xf1,kLogLevelError,"Unknown socket family %d in raptor_sockaddr_get_port");
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

int raptor_sockaddr_get_port(const raptor_resolved_address* resolved_addr) {
    const raptor_sockaddr* addr =
        reinterpret_cast<const raptor_sockaddr*>(resolved_addr->addr);
    switch (addr->sa_family) {
    case AF_INET:
        return ntohs(((raptor_sockaddr_in*)addr)->sin_port);
    case AF_INET6:
        return ntohs(((raptor_sockaddr_in6*)addr)->sin6_port);
    case AF_UNIX:  // is unix socket
        return 1;
    default:
        log_error("Unknown socket family %d in raptor_sockaddr_get_port", addr->sa_family);
        return 0;
    }
}